

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy.c
# Opt level: O0

SockAddr *
name_lookup(char *host,int port,char **canonicalname,Conf *conf,int addressfamily,LogContext *logctx
           ,char *reason)

{
  _Bool _Var1;
  int iVar2;
  char *pcVar3;
  LogContext *logctx_local;
  int addressfamily_local;
  Conf *conf_local;
  char **canonicalname_local;
  int port_local;
  char *host_local;
  
  iVar2 = conf_get_int(conf,0xd);
  if ((iVar2 == 0) ||
     (((iVar2 = conf_get_int(conf,0xb), iVar2 != 0 &&
       ((iVar2 = conf_get_int(conf,0xb), iVar2 != 2 || (iVar2 = conf_get_int(conf,0xd), iVar2 == 1))
       )) || (_Var1 = proxy_for_destination((SockAddr *)0x0,host,port,conf), !_Var1)))) {
    if (logctx != (LogContext *)0x0) {
      pcVar3 = dns_log_msg(host,addressfamily,reason);
      logevent_and_free(logctx,pcVar3);
    }
    host_local = (char *)sk_namelookup(host,canonicalname,addressfamily);
  }
  else {
    if (logctx != (LogContext *)0x0) {
      logeventf(logctx,"Leaving host lookup to proxy of \"%s\" (for %s)",host,reason);
    }
    pcVar3 = dupstr(host);
    *canonicalname = pcVar3;
    host_local = (char *)sk_nonamelookup(host);
  }
  return (SockAddr *)host_local;
}

Assistant:

SockAddr *name_lookup(const char *host, int port, char **canonicalname,
                     Conf *conf, int addressfamily, LogContext *logctx,
                     const char *reason)
{
    if (conf_get_int(conf, CONF_proxy_type) != PROXY_NONE &&
        do_proxy_dns(conf) &&
        proxy_for_destination(NULL, host, port, conf)) {

        if (logctx)
            logeventf(logctx, "Leaving host lookup to proxy of \"%s\""
                      " (for %s)", host, reason);

        *canonicalname = dupstr(host);
        return sk_nonamelookup(host);
    } else {
        if (logctx)
            logevent_and_free(
                logctx, dns_log_msg(host, addressfamily, reason));

        return sk_namelookup(host, canonicalname, addressfamily);
    }
}